

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

int my_numbox_check_minmax(t_my_numbox *x,double min,double max)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  
  if (x->x_lin0_log1 != 0) {
    max = (double)(~-(ulong)(min == 0.0) & (ulong)max |
                  (~-(ulong)(max == 0.0) & (ulong)max | -(ulong)(max == 0.0) & 0x3ff0000000000000) &
                  -(ulong)(min == 0.0));
    if (max <= 0.0) {
      if (0.0 < min) {
        max = min * 0.01;
      }
    }
    else if (min <= 0.0) {
      min = max * 0.01;
    }
  }
  x->x_min = min;
  x->x_max = max;
  bVar1 = (double)x->x_val < min;
  if (bVar1) {
    x->x_val = (float)min;
  }
  uVar2 = (uint)bVar1;
  if (max < (double)x->x_val) {
    x->x_val = (float)max;
    uVar2 = 1;
  }
  if (x->x_lin0_log1 == 0) {
    dVar3 = 1.0;
  }
  else {
    dVar3 = log(max / min);
    dVar3 = exp(dVar3 / (double)x->x_log_height);
  }
  x->x_k = dVar3;
  return uVar2;
}

Assistant:

int my_numbox_check_minmax(t_my_numbox *x, double min, double max)
{
    int ret = 0;

    if(x->x_lin0_log1)
    {
        if((min == 0.0) && (max == 0.0))
            max = 1.0;
        if(max > 0.0)
        {
            if(min <= 0.0)
                min = 0.01 * max;
        }
        else
        {
            if(min > 0.0)
                max = 0.01 * min;
        }
    }
    x->x_min = min;
    x->x_max = max;
    if(x->x_val < x->x_min)
    {
        x->x_val = x->x_min;
        ret = 1;
    }
    if(x->x_val > x->x_max)
    {
        x->x_val = x->x_max;
        ret = 1;
    }
    if(x->x_lin0_log1)
        x->x_k = exp(log(x->x_max/x->x_min) / (double)(x->x_log_height));
    else
        x->x_k = 1.0;
    return(ret);
}